

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkSweepBufsInvs(Abc_Ntk_t *pNtk,int fVerbose)

{
  Hop_Man_t *p;
  bool bVar1;
  int iVar2;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *p_00;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Abc_Obj_t *pFaninNew;
  uint local_48;
  int Counter;
  int fChanges;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Hop_Man_t *pMan;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  bVar1 = true;
  local_48 = 0;
  iVar2 = Abc_NtkIsLogic(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x3ce,"int Abc_NtkSweepBufsInvs(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkToAig(pNtk);
  if (iVar2 == 0) {
    fprintf(_stdout,"Converting to SOP has failed.\n");
    pNtk_local._4_4_ = 1;
  }
  else {
    p = (Hop_Man_t *)pNtk->pManFunc;
    Abc_NtkIncrementTravId(pNtk);
    while (bVar1) {
      bVar1 = false;
      for (fChanges = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), fChanges < iVar2; fChanges = fChanges + 1
          ) {
        pObj_00 = Abc_NtkObj(pNtk,fChanges);
        if (pObj_00 != (Abc_Obj_t *)0x0) {
          for (Counter = 0; iVar2 = Abc_ObjFaninNum(pObj_00), Counter < iVar2; Counter = Counter + 1
              ) {
            p_00 = Abc_ObjFanin(pObj_00,Counter);
            iVar2 = Abc_NodeIsTravIdCurrent(p_00);
            if ((((iVar2 == 0) && (iVar2 = Abc_ObjIsNode(p_00), iVar2 != 0)) &&
                (iVar2 = Abc_ObjFaninNum(p_00), iVar2 == 1)) &&
               ((iVar2 = Abc_ObjIsCo(pObj_00), iVar2 == 0 ||
                (iVar2 = Abc_NodeIsInv(p_00), iVar2 == 0)))) {
              bVar1 = true;
              local_48 = local_48 + 1;
              iVar2 = Abc_NodeIsInv(p_00);
              if (iVar2 != 0) {
                pHVar4 = (Hop_Obj_t *)(pObj_00->field_5).pData;
                pHVar3 = Hop_IthVar(p,Counter);
                pHVar3 = Hop_Not(pHVar3);
                pHVar4 = Hop_Compose(p,pHVar4,pHVar3,Counter);
                (pObj_00->field_5).pData = pHVar4;
              }
              pFaninNew = Abc_ObjFanin0(p_00);
              Abc_ObjPatchFanin(pObj_00,p_00,pFaninNew);
              iVar2 = Abc_ObjFanoutNum(p_00);
              if (iVar2 == 0) {
                Abc_NtkDeleteObj(p_00);
              }
            }
          }
        }
      }
    }
    if (fVerbose != 0) {
      printf("Removed %d single input nodes.\n",(ulong)local_48);
    }
    pNtk_local._4_4_ = local_48;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkSweepBufsInvs( Abc_Ntk_t * pNtk, int fVerbose )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fChanges = 1, Counter = 0;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 1;
    }
    // get AIG manager
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    // label selected nodes
    Abc_NtkIncrementTravId( pNtk );
    // iterate till no improvement
    while ( fChanges )
    {
        fChanges = 0;
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            Abc_ObjForEachFanin( pObj, pFanin, k )
            {
                // do not eliminate marked fanins
                if ( Abc_NodeIsTravIdCurrent(pFanin) )
                    continue;
                // do not eliminate constant nodes
                if ( !Abc_ObjIsNode(pFanin) || Abc_ObjFaninNum(pFanin) != 1 )
                    continue;
                // do not eliminate inverters into COs
                if ( Abc_ObjIsCo(pObj) && Abc_NodeIsInv(pFanin) )
                    continue;
                // do not eliminate buffers connecting PIs and POs 
//                if ( Abc_ObjIsCo(pObj) && Abc_ObjIsCi(Abc_ObjFanin0(pFanin)) )
//                    continue;
                fChanges = 1;
                Counter++;
                // update function of the node
                if ( Abc_NodeIsInv(pFanin) )
                    pObj->pData = Hop_Compose( pMan, (Hop_Obj_t *)pObj->pData, Hop_Not(Hop_IthVar(pMan, k)), k );
                // update the fanin
                Abc_ObjPatchFanin( pObj, pFanin, Abc_ObjFanin0(pFanin) );
                if ( Abc_ObjFanoutNum(pFanin) == 0 )
                    Abc_NtkDeleteObj(pFanin);            
            }
        }
    }
    if ( fVerbose )
        printf( "Removed %d single input nodes.\n", Counter );
    return Counter;
}